

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderSingle.h
# Opt level: O0

void __thiscall
FIX40::NewOrderSingle::NewOrderSingle
          (NewOrderSingle *this,ClOrdID *aClOrdID,HandlInst *aHandlInst,Symbol *aSymbol,Side *aSide,
          OrderQty *aOrderQty,OrdType *aOrdType)

{
  MsgType local_90;
  OrderQty *local_38;
  OrderQty *aOrderQty_local;
  Side *aSide_local;
  Symbol *aSymbol_local;
  HandlInst *aHandlInst_local;
  ClOrdID *aClOrdID_local;
  NewOrderSingle *this_local;
  
  local_38 = aOrderQty;
  aOrderQty_local = (OrderQty *)aSide;
  aSide_local = (Side *)aSymbol;
  aSymbol_local = (Symbol *)aHandlInst;
  aHandlInst_local = (HandlInst *)aClOrdID;
  aClOrdID_local = (ClOrdID *)this;
  MsgType();
  FIX40::Message::Message(&this->super_Message,&local_90);
  FIX::MsgType::~MsgType(&local_90);
  *(undefined ***)&this->super_Message = &PTR__NewOrderSingle_00189e48;
  set(this,(ClOrdID *)aHandlInst_local);
  set(this,(HandlInst *)aSymbol_local);
  set(this,(Symbol *)aSide_local);
  set(this,(Side *)aOrderQty_local);
  set(this,local_38);
  set(this,aOrdType);
  return;
}

Assistant:

NewOrderSingle(
      const FIX::ClOrdID& aClOrdID,
      const FIX::HandlInst& aHandlInst,
      const FIX::Symbol& aSymbol,
      const FIX::Side& aSide,
      const FIX::OrderQty& aOrderQty,
      const FIX::OrdType& aOrdType )
    : Message(MsgType())
    {
      set(aClOrdID);
      set(aHandlInst);
      set(aSymbol);
      set(aSide);
      set(aOrderQty);
      set(aOrdType);
    }